

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O0

void print_tool(MatchTool *tool,ostream *os)

{
  ostream *poVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int local_24;
  int local_20;
  int i_1;
  int j;
  int i;
  ostream *os_local;
  MatchTool *tool_local;
  
  poVar1 = std::operator<<(os,"{");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  i_1 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&tool->dtran);
    if (sVar2 <= (ulong)(long)i_1) break;
    std::operator<<(os,"\t{");
    local_20 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&tool->dtran,(long)i_1);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar2 <= (ulong)(long)local_20) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&tool->dtran,(long)i_1);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)local_20);
      std::ostream::operator<<(os,*pvVar4);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&tool->dtran,(long)i_1);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if ((long)local_20 != sVar2 - 1) {
        std::operator<<(os,", ");
      }
      local_20 = local_20 + 1;
    }
    poVar1 = std::operator<<(os,"}");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    i_1 = i_1 + 1;
  }
  std::operator<<(os,"}\n{");
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&tool->targets);
    if (sVar2 <= (ulong)(long)local_24) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&tool->targets,(long)local_24);
    std::ostream::operator<<(os,*pvVar4);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&tool->targets);
    if ((long)local_24 != sVar2 - 1) {
      std::operator<<(os,", ");
    }
    local_24 = local_24 + 1;
  }
  poVar1 = std::operator<<(os,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_tool(const MatchTool& tool, std::ostream& os) {
    os << "{" << endl;
    for (int i = 0; i < tool.dtran.size(); i++) {
        os << "\t{";
        for (int j = 0; j < tool.dtran[i].size(); j++) {
            os << tool.dtran[i][j];
            if (j != tool.dtran[i].size() - 1)
                os << ", ";
        }
        os << "}" << endl;
    }
    os << "}\n{";
    for (int i = 0; i < tool.targets.size(); i++) {
        os << tool.targets[i];
        if (i != tool.targets.size() - 1)
            os << ", ";
    }
    os << "}" << endl;

}